

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O0

void __thiscall deqp::egl::MultiThreadedObjectTest::deinit(MultiThreadedObjectTest *this)

{
  EGLDisplay pvVar1;
  deUint32 dVar2;
  deBool dVar3;
  Library *pLVar4;
  size_type sVar5;
  reference ppvVar6;
  reference pvVar7;
  reference pvVar8;
  int local_48;
  int local_44;
  int windowNdx_2;
  int windowNdx_1;
  int windowNdx;
  int pixmapNdx_2;
  int pixmapNdx_1;
  int pixmapNdx;
  int contextNdx_2;
  int contextNdx_1;
  int contextNdx;
  int pbufferNdx_2;
  int pbufferNdx_1;
  int pbufferNdx;
  Library *egl;
  MultiThreadedObjectTest *this_local;
  
  pLVar4 = MultiThreadedTest::getLibrary(&this->super_MultiThreadedTest);
  for (pbufferNdx_2 = 0;
      sVar5 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_pbuffers0),
      pbufferNdx_2 < (int)sVar5; pbufferNdx_2 = pbufferNdx_2 + 1) {
    ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        (&this->m_pbuffers0,(long)pbufferNdx_2);
    if (*ppvVar6 != (value_type)0x0) {
      pvVar1 = (this->super_MultiThreadedTest).m_display;
      ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&this->m_pbuffers0,(long)pbufferNdx_2);
      (*pLVar4->_vptr_Library[0x16])(pLVar4,pvVar1,*ppvVar6);
      dVar2 = (*pLVar4->_vptr_Library[0x1f])();
      eglu::checkError(dVar2,"eglDestroySurface()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x30e);
      ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&this->m_pbuffers0,(long)pbufferNdx_2);
      *ppvVar6 = (value_type)0x0;
    }
  }
  std::vector<void_*,_std::allocator<void_*>_>::clear(&this->m_pbuffers0);
  for (contextNdx = 0;
      sVar5 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_pbuffers1),
      contextNdx < (int)sVar5; contextNdx = contextNdx + 1) {
    ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        (&this->m_pbuffers1,(long)contextNdx);
    if (*ppvVar6 != (value_type)0x0) {
      pvVar1 = (this->super_MultiThreadedTest).m_display;
      ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&this->m_pbuffers1,(long)contextNdx);
      (*pLVar4->_vptr_Library[0x16])(pLVar4,pvVar1,*ppvVar6);
      dVar2 = (*pLVar4->_vptr_Library[0x1f])();
      eglu::checkError(dVar2,"eglDestroySurface()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x319);
      ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&this->m_pbuffers1,(long)contextNdx);
      *ppvVar6 = (value_type)0x0;
    }
  }
  std::vector<void_*,_std::allocator<void_*>_>::clear(&this->m_pbuffers1);
  for (contextNdx_1 = 0;
      sVar5 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_sharedPbuffers),
      contextNdx_1 < (int)sVar5; contextNdx_1 = contextNdx_1 + 1) {
    ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        (&this->m_sharedPbuffers,(long)contextNdx_1);
    if (*ppvVar6 != (value_type)0x0) {
      pvVar1 = (this->super_MultiThreadedTest).m_display;
      ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&this->m_sharedPbuffers,(long)contextNdx_1);
      (*pLVar4->_vptr_Library[0x16])(pLVar4,pvVar1,*ppvVar6);
      dVar2 = (*pLVar4->_vptr_Library[0x1f])();
      eglu::checkError(dVar2,"eglDestroySurface()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x324);
      ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&this->m_sharedPbuffers,(long)contextNdx_1);
      *ppvVar6 = (value_type)0x0;
    }
  }
  std::vector<void_*,_std::allocator<void_*>_>::clear(&this->m_sharedPbuffers);
  for (contextNdx_2 = 0;
      sVar5 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_sharedContexts),
      contextNdx_2 < (int)sVar5; contextNdx_2 = contextNdx_2 + 1) {
    ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        (&this->m_sharedContexts,(long)contextNdx_2);
    if (*ppvVar6 != (value_type)0x0) {
      pvVar1 = (this->super_MultiThreadedTest).m_display;
      ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&this->m_sharedContexts,(long)contextNdx_2);
      (*pLVar4->_vptr_Library[0x13])(pLVar4,pvVar1,*ppvVar6);
      dVar2 = (*pLVar4->_vptr_Library[0x1f])();
      eglu::checkError(dVar2,"eglDestroyContext()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x32f);
      ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&this->m_sharedContexts,(long)contextNdx_2);
      *ppvVar6 = (value_type)0x0;
    }
  }
  std::vector<void_*,_std::allocator<void_*>_>::clear(&this->m_sharedContexts);
  for (pixmapNdx = 0; sVar5 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_contexts0)
      , pixmapNdx < (int)sVar5; pixmapNdx = pixmapNdx + 1) {
    ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        (&this->m_contexts0,(long)pixmapNdx);
    if (*ppvVar6 != (value_type)0x0) {
      pvVar1 = (this->super_MultiThreadedTest).m_display;
      ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&this->m_contexts0,(long)pixmapNdx);
      (*pLVar4->_vptr_Library[0x13])(pLVar4,pvVar1,*ppvVar6);
      dVar2 = (*pLVar4->_vptr_Library[0x1f])();
      eglu::checkError(dVar2,"eglDestroyContext()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x33a);
      ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&this->m_contexts0,(long)pixmapNdx);
      *ppvVar6 = (value_type)0x0;
    }
  }
  std::vector<void_*,_std::allocator<void_*>_>::clear(&this->m_contexts0);
  for (pixmapNdx_1 = 0;
      sVar5 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_contexts1),
      pixmapNdx_1 < (int)sVar5; pixmapNdx_1 = pixmapNdx_1 + 1) {
    ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        (&this->m_contexts1,(long)pixmapNdx_1);
    if (*ppvVar6 != (value_type)0x0) {
      pvVar1 = (this->super_MultiThreadedTest).m_display;
      ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&this->m_contexts1,(long)pixmapNdx_1);
      (*pLVar4->_vptr_Library[0x13])(pLVar4,pvVar1,*ppvVar6);
      dVar2 = (*pLVar4->_vptr_Library[0x1f])();
      eglu::checkError(dVar2,"eglDestroyContext()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x345);
      ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&this->m_contexts1,(long)pixmapNdx_1);
      *ppvVar6 = (value_type)0x0;
    }
  }
  std::vector<void_*,_std::allocator<void_*>_>::clear(&this->m_contexts1);
  for (pixmapNdx_2 = 0;
      sVar5 = std::
              vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
              ::size(&this->m_nativePixmaps0), pixmapNdx_2 < (int)sVar5;
      pixmapNdx_2 = pixmapNdx_2 + 1) {
    pvVar7 = std::
             vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
             ::operator[](&this->m_nativePixmaps0,(long)pixmapNdx_2);
    if (pvVar7->second != (void *)0x0) {
      do {
        pvVar1 = (this->super_MultiThreadedTest).m_display;
        pvVar7 = std::
                 vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                 ::operator[](&this->m_nativePixmaps0,(long)pixmapNdx_2);
        (*pLVar4->_vptr_Library[0x16])(pLVar4,pvVar1,pvVar7->second);
        dVar2 = (*pLVar4->_vptr_Library[0x1f])();
        eglu::checkError(dVar2,"destroySurface(m_display, m_nativePixmaps0[pixmapNdx].second)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x34f);
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
    }
    pvVar7 = std::
             vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
             ::operator[](&this->m_nativePixmaps0,(long)pixmapNdx_2);
    pvVar7->second = (void *)0x0;
    pvVar7 = std::
             vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
             ::operator[](&this->m_nativePixmaps0,(long)pixmapNdx_2);
    if (pvVar7->first != (NativePixmap *)0x0) {
      (**(code **)(*(long *)pvVar7->first + 8))();
    }
    pvVar7 = std::
             vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
             ::operator[](&this->m_nativePixmaps0,(long)pixmapNdx_2);
    pvVar7->first = (NativePixmap *)0x0;
  }
  std::
  vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
  ::clear(&this->m_nativePixmaps0);
  for (windowNdx = 0;
      sVar5 = std::
              vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
              ::size(&this->m_nativePixmaps1), windowNdx < (int)sVar5; windowNdx = windowNdx + 1) {
    pvVar7 = std::
             vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
             ::operator[](&this->m_nativePixmaps1,(long)windowNdx);
    if (pvVar7->second != (void *)0x0) {
      do {
        pvVar1 = (this->super_MultiThreadedTest).m_display;
        pvVar7 = std::
                 vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                 ::operator[](&this->m_nativePixmaps1,(long)windowNdx);
        (*pLVar4->_vptr_Library[0x16])(pLVar4,pvVar1,pvVar7->second);
        dVar2 = (*pLVar4->_vptr_Library[0x1f])();
        eglu::checkError(dVar2,"destroySurface(m_display, m_nativePixmaps1[pixmapNdx].second)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x35a);
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
    }
    pvVar7 = std::
             vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
             ::operator[](&this->m_nativePixmaps1,(long)windowNdx);
    pvVar7->second = (void *)0x0;
    pvVar7 = std::
             vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
             ::operator[](&this->m_nativePixmaps1,(long)windowNdx);
    if (pvVar7->first != (NativePixmap *)0x0) {
      (**(code **)(*(long *)pvVar7->first + 8))();
    }
    pvVar7 = std::
             vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
             ::operator[](&this->m_nativePixmaps1,(long)windowNdx);
    pvVar7->first = (NativePixmap *)0x0;
  }
  std::
  vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
  ::clear(&this->m_nativePixmaps1);
  for (windowNdx_1 = 0;
      sVar5 = std::
              vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
              ::size(&this->m_sharedNativePixmaps), windowNdx_1 < (int)sVar5;
      windowNdx_1 = windowNdx_1 + 1) {
    pvVar7 = std::
             vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
             ::operator[](&this->m_sharedNativePixmaps,(long)windowNdx_1);
    if (pvVar7->second != (void *)0x0) {
      do {
        pvVar1 = (this->super_MultiThreadedTest).m_display;
        pvVar7 = std::
                 vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                 ::operator[](&this->m_sharedNativePixmaps,(long)windowNdx_1);
        (*pLVar4->_vptr_Library[0x16])(pLVar4,pvVar1,pvVar7->second);
        dVar2 = (*pLVar4->_vptr_Library[0x1f])();
        eglu::checkError(dVar2,"destroySurface(m_display, m_sharedNativePixmaps[pixmapNdx].second)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x365);
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
    }
    pvVar7 = std::
             vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
             ::operator[](&this->m_sharedNativePixmaps,(long)windowNdx_1);
    pvVar7->second = (void *)0x0;
    pvVar7 = std::
             vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
             ::operator[](&this->m_sharedNativePixmaps,(long)windowNdx_1);
    if (pvVar7->first != (NativePixmap *)0x0) {
      (**(code **)(*(long *)pvVar7->first + 8))();
    }
    pvVar7 = std::
             vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
             ::operator[](&this->m_sharedNativePixmaps,(long)windowNdx_1);
    pvVar7->first = (NativePixmap *)0x0;
  }
  std::
  vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
  ::clear(&this->m_sharedNativePixmaps);
  for (windowNdx_2 = 0;
      sVar5 = std::
              vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
              ::size(&this->m_nativeWindows1), windowNdx_2 < (int)sVar5;
      windowNdx_2 = windowNdx_2 + 1) {
    pvVar8 = std::
             vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             ::operator[](&this->m_nativeWindows1,(long)windowNdx_2);
    if (pvVar8->second != (void *)0x0) {
      do {
        pvVar1 = (this->super_MultiThreadedTest).m_display;
        pvVar8 = std::
                 vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                 ::operator[](&this->m_nativeWindows1,(long)windowNdx_2);
        (*pLVar4->_vptr_Library[0x16])(pLVar4,pvVar1,pvVar8->second);
        dVar2 = (*pLVar4->_vptr_Library[0x1f])();
        eglu::checkError(dVar2,"destroySurface(m_display, m_nativeWindows1[windowNdx].second)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x371);
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
    }
    pvVar8 = std::
             vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             ::operator[](&this->m_nativeWindows1,(long)windowNdx_2);
    pvVar8->second = (void *)0x0;
    pvVar8 = std::
             vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             ::operator[](&this->m_nativeWindows1,(long)windowNdx_2);
    if (pvVar8->first != (NativeWindow *)0x0) {
      (*pvVar8->first->_vptr_NativeWindow[1])();
    }
    pvVar8 = std::
             vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             ::operator[](&this->m_nativeWindows1,(long)windowNdx_2);
    pvVar8->first = (NativeWindow *)0x0;
  }
  std::
  vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
  ::clear(&this->m_nativeWindows1);
  for (local_44 = 0;
      sVar5 = std::
              vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
              ::size(&this->m_nativeWindows0), local_44 < (int)sVar5; local_44 = local_44 + 1) {
    pvVar8 = std::
             vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             ::operator[](&this->m_nativeWindows0,(long)local_44);
    if (pvVar8->second != (void *)0x0) {
      do {
        pvVar1 = (this->super_MultiThreadedTest).m_display;
        pvVar8 = std::
                 vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                 ::operator[](&this->m_nativeWindows0,(long)local_44);
        (*pLVar4->_vptr_Library[0x16])(pLVar4,pvVar1,pvVar8->second);
        dVar2 = (*pLVar4->_vptr_Library[0x1f])();
        eglu::checkError(dVar2,"destroySurface(m_display, m_nativeWindows0[windowNdx].second)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x37c);
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
    }
    pvVar8 = std::
             vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             ::operator[](&this->m_nativeWindows0,(long)local_44);
    pvVar8->second = (void *)0x0;
    pvVar8 = std::
             vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             ::operator[](&this->m_nativeWindows0,(long)local_44);
    if (pvVar8->first != (NativeWindow *)0x0) {
      (*pvVar8->first->_vptr_NativeWindow[1])();
    }
    pvVar8 = std::
             vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             ::operator[](&this->m_nativeWindows0,(long)local_44);
    pvVar8->first = (NativeWindow *)0x0;
  }
  std::
  vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
  ::clear(&this->m_nativeWindows0);
  for (local_48 = 0;
      sVar5 = std::
              vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
              ::size(&this->m_sharedNativeWindows), local_48 < (int)sVar5; local_48 = local_48 + 1)
  {
    pvVar8 = std::
             vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             ::operator[](&this->m_sharedNativeWindows,(long)local_48);
    if (pvVar8->second != (void *)0x0) {
      do {
        pvVar1 = (this->super_MultiThreadedTest).m_display;
        pvVar8 = std::
                 vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                 ::operator[](&this->m_sharedNativeWindows,(long)local_48);
        (*pLVar4->_vptr_Library[0x16])(pLVar4,pvVar1,pvVar8->second);
        dVar2 = (*pLVar4->_vptr_Library[0x1f])();
        eglu::checkError(dVar2,"destroySurface(m_display, m_sharedNativeWindows[windowNdx].second)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x387);
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
    }
    pvVar8 = std::
             vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             ::operator[](&this->m_sharedNativeWindows,(long)local_48);
    pvVar8->second = (void *)0x0;
    pvVar8 = std::
             vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             ::operator[](&this->m_sharedNativeWindows,(long)local_48);
    if (pvVar8->first != (NativeWindow *)0x0) {
      (*pvVar8->first->_vptr_NativeWindow[1])();
    }
    pvVar8 = std::
             vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             ::operator[](&this->m_sharedNativeWindows,(long)local_48);
    pvVar8->first = (NativeWindow *)0x0;
  }
  std::
  vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
  ::clear(&this->m_sharedNativeWindows);
  MultiThreadedTest::deinit(&this->super_MultiThreadedTest);
  return;
}

Assistant:

void MultiThreadedObjectTest::deinit (void)
{
	const Library&		egl		= getLibrary();

	// Clear pbuffers
	for (int pbufferNdx = 0; pbufferNdx < (int)m_pbuffers0.size(); pbufferNdx++)
	{
		if (m_pbuffers0[pbufferNdx] != EGL_NO_SURFACE)
		{
			egl.destroySurface(m_display, m_pbuffers0[pbufferNdx]);
			EGLU_CHECK_MSG(egl, "eglDestroySurface()");
			m_pbuffers0[pbufferNdx] = EGL_NO_SURFACE;
		}
	}
	m_pbuffers0.clear();

	for (int pbufferNdx = 0; pbufferNdx < (int)m_pbuffers1.size(); pbufferNdx++)
	{
		if (m_pbuffers1[pbufferNdx] != EGL_NO_SURFACE)
		{
			egl.destroySurface(m_display, m_pbuffers1[pbufferNdx]);
			EGLU_CHECK_MSG(egl, "eglDestroySurface()");
			m_pbuffers1[pbufferNdx] = EGL_NO_SURFACE;
		}
	}
	m_pbuffers1.clear();

	for (int pbufferNdx = 0; pbufferNdx < (int)m_sharedPbuffers.size(); pbufferNdx++)
	{
		if (m_sharedPbuffers[pbufferNdx] != EGL_NO_SURFACE)
		{
			egl.destroySurface(m_display, m_sharedPbuffers[pbufferNdx]);
			EGLU_CHECK_MSG(egl, "eglDestroySurface()");
			m_sharedPbuffers[pbufferNdx] = EGL_NO_SURFACE;
		}
	}
	m_sharedPbuffers.clear();

	for (int contextNdx = 0; contextNdx < (int)m_sharedContexts.size(); contextNdx++)
	{
		if (m_sharedContexts[contextNdx] != EGL_NO_CONTEXT)
		{
			egl.destroyContext(m_display, m_sharedContexts[contextNdx]);
			EGLU_CHECK_MSG(egl, "eglDestroyContext()");
			m_sharedContexts[contextNdx] =  EGL_NO_CONTEXT;
		}
	}
	m_sharedContexts.clear();

	for (int contextNdx = 0; contextNdx < (int)m_contexts0.size(); contextNdx++)
	{
		if (m_contexts0[contextNdx] != EGL_NO_CONTEXT)
		{
			egl.destroyContext(m_display, m_contexts0[contextNdx]);
			EGLU_CHECK_MSG(egl, "eglDestroyContext()");
			m_contexts0[contextNdx] =  EGL_NO_CONTEXT;
		}
	}
	m_contexts0.clear();

	for (int contextNdx = 0; contextNdx < (int)m_contexts1.size(); contextNdx++)
	{
		if (m_contexts1[contextNdx] != EGL_NO_CONTEXT)
		{
			egl.destroyContext(m_display, m_contexts1[contextNdx]);
			EGLU_CHECK_MSG(egl, "eglDestroyContext()");
			m_contexts1[contextNdx] =  EGL_NO_CONTEXT;
		}
	}
	m_contexts1.clear();

	// Clear pixmaps
	for (int pixmapNdx = 0; pixmapNdx < (int)m_nativePixmaps0.size(); pixmapNdx++)
	{
		if (m_nativePixmaps0[pixmapNdx].second != EGL_NO_SURFACE)
			EGLU_CHECK_CALL(egl, destroySurface(m_display, m_nativePixmaps0[pixmapNdx].second));

		m_nativePixmaps0[pixmapNdx].second = EGL_NO_SURFACE;
		delete m_nativePixmaps0[pixmapNdx].first;
		m_nativePixmaps0[pixmapNdx].first = NULL;
	}
	m_nativePixmaps0.clear();

	for (int pixmapNdx = 0; pixmapNdx < (int)m_nativePixmaps1.size(); pixmapNdx++)
	{
		if (m_nativePixmaps1[pixmapNdx].second != EGL_NO_SURFACE)
			EGLU_CHECK_CALL(egl, destroySurface(m_display, m_nativePixmaps1[pixmapNdx].second));

		m_nativePixmaps1[pixmapNdx].second = EGL_NO_SURFACE;
		delete m_nativePixmaps1[pixmapNdx].first;
		m_nativePixmaps1[pixmapNdx].first = NULL;
	}
	m_nativePixmaps1.clear();

	for (int pixmapNdx = 0; pixmapNdx < (int)m_sharedNativePixmaps.size(); pixmapNdx++)
	{
		if (m_sharedNativePixmaps[pixmapNdx].second != EGL_NO_SURFACE)
			EGLU_CHECK_CALL(egl, destroySurface(m_display, m_sharedNativePixmaps[pixmapNdx].second));

		m_sharedNativePixmaps[pixmapNdx].second = EGL_NO_SURFACE;
		delete m_sharedNativePixmaps[pixmapNdx].first;
		m_sharedNativePixmaps[pixmapNdx].first = NULL;
	}
	m_sharedNativePixmaps.clear();

	// Clear windows
	for (int windowNdx = 0; windowNdx < (int)m_nativeWindows1.size(); windowNdx++)
	{
		if (m_nativeWindows1[windowNdx].second != EGL_NO_SURFACE)
			EGLU_CHECK_CALL(egl, destroySurface(m_display, m_nativeWindows1[windowNdx].second));

		m_nativeWindows1[windowNdx].second = EGL_NO_SURFACE;
		delete m_nativeWindows1[windowNdx].first;
		m_nativeWindows1[windowNdx].first = NULL;
	}
	m_nativeWindows1.clear();

	for (int windowNdx = 0; windowNdx < (int)m_nativeWindows0.size(); windowNdx++)
	{
		if (m_nativeWindows0[windowNdx].second != EGL_NO_SURFACE)
			EGLU_CHECK_CALL(egl, destroySurface(m_display, m_nativeWindows0[windowNdx].second));

		m_nativeWindows0[windowNdx].second = EGL_NO_SURFACE;
		delete m_nativeWindows0[windowNdx].first;
		m_nativeWindows0[windowNdx].first = NULL;
	}
	m_nativeWindows0.clear();

	for (int windowNdx = 0; windowNdx < (int)m_sharedNativeWindows.size(); windowNdx++)
	{
		if (m_sharedNativeWindows[windowNdx].second != EGL_NO_SURFACE)
			EGLU_CHECK_CALL(egl, destroySurface(m_display, m_sharedNativeWindows[windowNdx].second));

		m_sharedNativeWindows[windowNdx].second = EGL_NO_SURFACE;
		delete m_sharedNativeWindows[windowNdx].first;
		m_sharedNativeWindows[windowNdx].first = NULL;
	}
	m_sharedNativeWindows.clear();

	MultiThreadedTest::deinit();
}